

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_interface.c
# Opt level: O0

int dlep_if_add(dlep_if *interf,char *ifname,oonf_layer2_origin *l2_origin,
               oonf_layer2_origin *l2_default_origin,_func_int_os_interface_listener_ptr *if_changed
               ,oonf_log_source log_src,_Bool radio)

{
  list_entity *plVar1;
  list_entity *plVar2;
  int iVar3;
  avl_tree *paVar4;
  dlep_signals dVar5;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  dlep_extension *ext;
  _Bool radio_local;
  oonf_log_source log_src_local;
  _func_int_os_interface_listener_ptr *if_changed_local;
  oonf_layer2_origin *l2_default_origin_local;
  oonf_layer2_origin *l2_origin_local;
  char *ifname_local;
  dlep_if *interf_local;
  
  strscpy(interf->l2_ifname,ifname,0x10);
  (interf->_node).key = interf->l2_ifname;
  iVar3 = abuf_init(&interf->udp_out);
  if (iVar3 == 0) {
    abuf_memcpy(&interf->udp_out,"DLEP",4);
    iVar3 = dlep_session_add(&interf->session,interf->l2_ifname,l2_origin,l2_default_origin,
                             &interf->udp_out,radio,if_changed,log_src);
    if (iVar3 == 0) {
      interf->radio = radio;
      avl_init(&interf->session_tree,avl_comp_netaddr_socket,false);
      (interf->udp).config.user = interf;
      (interf->udp).config.receive_data = _cb_receive_udp;
      oonf_packet_add_managed(&interf->udp);
      (interf->session).cb_send_buffer = _cb_send_multicast;
      (interf->session).cb_end_session = (_func_void_dlep_session_ptr *)0x0;
      dVar5 = DLEP_UDP_PEER_OFFER;
      if (radio) {
        dVar5 = DLEP_UDP_PEER_DISCOVERY;
      }
      (interf->session).restrict_signal = dVar5;
      (interf->session).writer.out = &interf->udp_out;
      paVar4 = dlep_if_get_tree(radio);
      avl_insert(paVar4,&interf->_node);
      paVar4 = dlep_extension_get_tree();
      for (plVar1 = (paVar4->list_head).next; plVar2 = plVar1->prev,
          paVar4 = dlep_extension_get_tree(), plVar2 != (paVar4->list_head).prev;
          plVar1 = plVar1->next) {
        if (radio) {
          if (plVar1[-4].next != (list_entity *)0x0) {
            (*(code *)plVar1[-4].next)(interf);
          }
        }
        else if (plVar1[-4].prev != (list_entity *)0x0) {
          (*(code *)plVar1[-4].prev)(interf);
        }
      }
      interf_local._4_4_ = 0;
    }
    else {
      abuf_free(&interf->udp_out);
      interf_local._4_4_ = -1;
    }
  }
  else {
    interf_local._4_4_ = -1;
  }
  return interf_local._4_4_;
}

Assistant:

int
dlep_if_add(struct dlep_if *interf, const char *ifname, const struct oonf_layer2_origin *l2_origin,
  const struct oonf_layer2_origin *l2_default_origin,
  int (*if_changed)(struct os_interface_listener *), enum oonf_log_source log_src, bool radio) {
  struct dlep_extension *ext;

  /* initialize key */
  strscpy(interf->l2_ifname, ifname, sizeof(interf->l2_ifname));
  interf->_node.key = interf->l2_ifname;

  if (abuf_init(&interf->udp_out)) {
    return -1;
  }

  /* add dlep prefix to buffer */
  abuf_memcpy(&interf->udp_out, _DLEP_PREFIX, sizeof(_DLEP_PREFIX) - 1);

  if (dlep_session_add(&interf->session, interf->l2_ifname,
    l2_origin, l2_default_origin, &interf->udp_out, radio, if_changed, log_src)) {
    abuf_free(&interf->udp_out);
    return -1;
  }

  /* remember if this is a radio interface */
  interf->radio = radio;

  /* initialize stream list */
  avl_init(&interf->session_tree, avl_comp_netaddr_socket, false);

  /* initialize discovery socket */
  interf->udp.config.user = interf;
  interf->udp.config.receive_data = _cb_receive_udp;
  oonf_packet_add_managed(&interf->udp);

  /* initialize session */
  interf->session.cb_send_buffer = _cb_send_multicast;
  interf->session.cb_end_session = NULL;
  interf->session.restrict_signal = radio ? DLEP_UDP_PEER_DISCOVERY : DLEP_UDP_PEER_OFFER;
  interf->session.writer.out = &interf->udp_out;

  /* add to tree */
  avl_insert(dlep_if_get_tree(radio), &interf->_node);

  /* inform all extension */
  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (radio) {
      if (ext->cb_session_init_radio) {
        ext->cb_session_init_radio(&interf->session);
      }
    }
    else {
      if (ext->cb_session_init_router) {
        ext->cb_session_init_router(&interf->session);
      }
    }
  }
  return 0;
}